

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

void upb_inttable_removeiter(upb_inttable *t,intptr_t *iter)

{
  _upb_tabent *p_Var1;
  byte bVar2;
  ulong uVar3;
  long lVar4;
  upb_tabent *e;
  upb_tabent *puVar5;
  upb_tabent *puVar6;
  
  uVar3 = *iter;
  if (uVar3 < t->array_size) {
    t->array_count = t->array_count - 1;
    t->array[uVar3].val = 0xffffffffffffffff;
    return;
  }
  puVar5 = (t->t).entries;
  p_Var1 = puVar5 + (uVar3 - t->array_size);
  bVar2 = (t->t).size_lg2;
  puVar6 = (upb_tabent *)0x0;
  if (bVar2 != 0) {
    lVar4 = (long)(1 << (bVar2 & 0x1f)) * 0x18;
    do {
      puVar6 = puVar5;
      if (puVar5->next == p_Var1) break;
      puVar5 = puVar5 + 1;
      lVar4 = lVar4 + -0x18;
      puVar6 = (upb_tabent *)0x0;
    } while (lVar4 != 0);
  }
  if (puVar6 != (upb_tabent *)0x0) {
    puVar6->next = p_Var1->next;
  }
  (t->t).count = (t->t).count - 1;
  p_Var1->key = 0;
  p_Var1->next = (_upb_tabent *)0x0;
  return;
}

Assistant:

void upb_inttable_removeiter(upb_inttable* t, intptr_t* iter) {
  intptr_t i = *iter;
  if ((size_t)i < t->array_size) {
    t->array_count--;
    mutable_array(t)[i].val = -1;
  } else {
    upb_tabent* ent = &t->t.entries[i - t->array_size];
    upb_tabent* prev = NULL;

    // Linear search, not great.
    upb_tabent* end = &t->t.entries[upb_table_size(&t->t)];
    for (upb_tabent* e = t->t.entries; e != end; e++) {
      if (e->next == ent) {
        prev = e;
        break;
      }
    }

    if (prev) {
      prev->next = ent->next;
    }

    t->t.count--;
    ent->key = 0;
    ent->next = NULL;
  }
}